

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
kj::Vector<capnp::compiler::Compiler::Node_*>::setCapacity
          (Vector<capnp::compiler::Compiler::Node_*> *this,size_t newSize)

{
  Node **ppNVar1;
  Node **ppNVar2;
  RemoveConst<capnp::compiler::Compiler::Node_*> *ppNVar3;
  ulong __n;
  ArrayBuilder<capnp::compiler::Compiler::Node_*> local_38;
  
  ppNVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)ppNVar1 >> 3)) {
    (this->builder).pos = ppNVar1 + newSize;
  }
  local_38.pos = (RemoveConst<capnp::compiler::Compiler::Node_*> *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (8,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.pos + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  ppNVar1 = (this->builder).ptr;
  ppNVar2 = (this->builder).pos;
  local_38.ptr = local_38.pos;
  if (ppNVar1 != ppNVar2) {
    __n = (long)ppNVar2 - (long)ppNVar1 & 0xfffffffffffffff8;
    memcpy(local_38.pos,ppNVar1,__n);
    local_38.pos = (RemoveConst<capnp::compiler::Compiler::Node_*> *)((long)local_38.pos + __n);
  }
  ArrayBuilder<capnp::compiler::Compiler::Node_*>::operator=(&this->builder,&local_38);
  ppNVar2 = local_38.endPtr;
  ppNVar3 = local_38.pos;
  ppNVar1 = local_38.ptr;
  if (local_38.ptr != (Node **)0x0) {
    local_38.ptr = (Node **)0x0;
    local_38.pos = (RemoveConst<capnp::compiler::Compiler::Node_*> *)0x0;
    local_38.endPtr = (Node **)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,ppNVar1,8,(long)ppNVar3 - (long)ppNVar1 >> 3,
               (long)ppNVar2 - (long)ppNVar1 >> 3,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }